

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_file.c
# Opt level: O2

void x_file_setup(void)

{
  undefined8 in_RAX;
  t_symbol *ptVar1;
  _class *p_Var2;
  uint uVar3;
  
  uVar3 = (uint)((ulong)in_RAX >> 0x20);
  ptVar1 = gensym("file");
  class_addcreator(fileobj_new,ptVar1,A_GIMME,0);
  ptVar1 = gensym("file define");
  file_define_class =
       class_new(ptVar1,file_define_new,file_define_free,0x68,8,A_GIMME,(ulong)uVar3 << 0x20);
  class_addanything(file_define_class,file_define_ignore);
  p_Var2 = file_define_class;
  ptVar1 = gensym("file");
  class_sethelpsymbol(p_Var2,ptVar1);
  p_Var2 = file_class_new("file handle",file_handle_new,file_handle_free,
                          (_func_void_t_file_handle_ptr_t_symbol_ptr *)0x0,MODE|VERBOSE);
  file_handle_class = p_Var2;
  ptVar1 = gensym("open");
  class_addmethod(p_Var2,file_handle_open,ptVar1,A_SYMBOL,7,0);
  p_Var2 = file_handle_class;
  ptVar1 = gensym("close");
  class_addmethod(p_Var2,file_handle_close,ptVar1,A_NULL);
  p_Var2 = file_handle_class;
  ptVar1 = gensym("seek");
  class_addmethod(p_Var2,file_handle_seek,ptVar1,A_GIMME,0);
  p_Var2 = file_handle_class;
  ptVar1 = gensym("set");
  class_addmethod(p_Var2,file_handle_set,ptVar1,A_DEFSYM,0);
  class_addlist(file_handle_class,file_handle_list);
  file_which_class =
       file_class_new("file which",file_which_new,(_func_void_t_file_handle_ptr *)0x0,
                      file_which_symbol,VERBOSE);
  file_glob_class =
       file_class_new("file glob",file_glob_new,(_func_void_t_file_handle_ptr *)0x0,file_glob_symbol
                      ,VERBOSE);
  file_stat_class =
       file_class_new("file stat",file_stat_new,(_func_void_t_file_handle_ptr *)0x0,file_stat_symbol
                      ,VERBOSE);
  file_size_class =
       file_class_new("file size",file_size_new,(_func_void_t_file_handle_ptr *)0x0,file_size_symbol
                      ,VERBOSE);
  file_isfile_class =
       file_class_new("file isfile",file_isfile_new,(_func_void_t_file_handle_ptr *)0x0,
                      file_isfile_symbol,VERBOSE);
  file_isdirectory_class =
       file_class_new("file isdirectory",file_isdirectory_new,(_func_void_t_file_handle_ptr *)0x0,
                      file_isdirectory_symbol,VERBOSE);
  file_mkdir_class =
       file_class_new("file mkdir",file_mkdir_new,(_func_void_t_file_handle_ptr *)0x0,
                      file_mkdir_symbol,MODE|VERBOSE);
  p_Var2 = file_class_new("file delete",file_delete_new,(_func_void_t_file_handle_ptr *)0x0,
                          file_delete_symbol,VERBOSE);
  file_delete_class = p_Var2;
  ptVar1 = gensym("recursive");
  class_addmethod(p_Var2,file_delete_recursive,ptVar1,A_SYMBOL,0);
  file_copy_class =
       file_class_new("file copy",file_copy_new,(_func_void_t_file_handle_ptr *)0x0,
                      (_func_void_t_file_handle_ptr_t_symbol_ptr *)0x0,MODE|VERBOSE);
  class_addlist(file_copy_class,file_copy_list);
  file_move_class =
       file_class_new("file move",file_move_new,(_func_void_t_file_handle_ptr *)0x0,
                      (_func_void_t_file_handle_ptr_t_symbol_ptr *)0x0,MODE|VERBOSE);
  class_addlist(file_move_class,file_move_list);
  file_split_class =
       file_class_new("file split",file_split_new,(_func_void_t_file_handle_ptr *)0x0,
                      file_split_symbol,DEFAULT);
  file_join_class =
       file_class_new("file join",file_join_new,(_func_void_t_file_handle_ptr *)0x0,
                      (_func_void_t_file_handle_ptr_t_symbol_ptr *)0x0,DEFAULT);
  class_addlist(file_join_class,file_join_list);
  file_splitext_class =
       file_class_new("file splitext",file_splitext_new,(_func_void_t_file_handle_ptr *)0x0,
                      file_splitext_symbol,DEFAULT);
  file_splitname_class =
       file_class_new("file splitname",file_splitname_new,(_func_void_t_file_handle_ptr *)0x0,
                      file_splitname_symbol,DEFAULT);
  return;
}

Assistant:

void x_file_setup(void)
{
    class_addcreator((t_newmethod)fileobj_new, gensym("file"), A_GIMME, 0);

        /* [file define] */
    file_define_class = class_new(gensym("file define"),
                                  (t_newmethod)file_define_new, (t_method)file_define_free,
                                  sizeof(t_file_handle), CLASS_NOINLET, A_GIMME, 0);
    class_addanything(file_define_class, file_define_ignore);
    class_sethelpsymbol(file_define_class, gensym("file"));

        /* [file handle] */
    file_handle_class = file_class_new("file handle", file_handle_new, file_handle_free, 0, MODE|VERBOSE);
    class_addmethod(file_handle_class, (t_method)file_handle_open,
        gensym("open"), A_SYMBOL, A_DEFSYM, 0);
    class_addmethod(file_handle_class, (t_method)file_handle_close,
        gensym("close"), 0);
    class_addmethod(file_handle_class, (t_method)file_handle_seek,
        gensym("seek"), A_GIMME, 0);
    class_addmethod(file_handle_class, (t_method)file_handle_set,
        gensym("set"), A_DEFSYMBOL, 0);
    class_addlist(file_handle_class, file_handle_list);

        /* [file which] */
    file_which_class = file_class_new("file which", file_which_new, 0, file_which_symbol, VERBOSE);

        /* [file glob] */
    file_glob_class = file_class_new("file glob", file_glob_new, 0, file_glob_symbol, VERBOSE);

        /* [file stat] */
    file_stat_class = file_class_new("file stat", file_stat_new, 0, file_stat_symbol, VERBOSE);
    file_size_class = file_class_new("file size", file_size_new, 0, file_size_symbol, VERBOSE);
    file_isfile_class = file_class_new("file isfile", file_isfile_new, 0, file_isfile_symbol, VERBOSE);
    file_isdirectory_class = file_class_new("file isdirectory", file_isdirectory_new, 0, file_isdirectory_symbol, VERBOSE);

        /* [file mkdir] */
    file_mkdir_class = file_class_new("file mkdir", file_mkdir_new, 0, file_mkdir_symbol, MODE|VERBOSE);

        /* [file delete] */
    file_delete_class = file_class_new("file delete", file_delete_new, 0, file_delete_symbol, VERBOSE);
    class_addmethod(file_delete_class, (t_method)file_delete_recursive,
        gensym("recursive"), A_SYMBOL, 0);

        /* [file copy] */
    file_copy_class = file_class_new("file copy", file_copy_new, 0, 0, MODE|VERBOSE);
    class_addlist(file_copy_class, (t_method)file_copy_list);

        /* [file move] */
    file_move_class = file_class_new("file move", file_move_new, 0, 0, MODE|VERBOSE);
    class_addlist(file_move_class, (t_method)file_move_list);

        /* file path objects */
    file_split_class = file_class_new("file split", file_split_new, 0, file_split_symbol, DEFAULT);
    file_join_class = file_class_new("file join", file_join_new, 0, 0, DEFAULT);
    class_addlist(file_join_class, (t_method)file_join_list);
    file_splitext_class = file_class_new("file splitext", file_splitext_new, 0, file_splitext_symbol, DEFAULT);
    file_splitname_class = file_class_new("file splitname", file_splitname_new, 0, file_splitname_symbol, DEFAULT);
}